

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxPrinter.cpp
# Opt level: O2

SyntaxPrinter * __thiscall slang::syntax::SyntaxPrinter::print(SyntaxPrinter *this,Trivia trivia)

{
  char cVar1;
  Token *pTVar2;
  SyntaxNode *pSVar3;
  Trivia *pTVar4;
  iterator __begin5;
  long lVar5;
  span<const_slang::parsing::Token,_18446744073709551615UL> sVar6;
  string_view text;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  anon_union_12_4_39e54f29_for_Trivia_0 local_38;
  Token local_28;
  
  register0x00000010 = trivia._8_8_;
  local_38.rawText.ptr = (char *)trivia.field_0._0_8_;
  switch(trivia._12_4_ >> 8 & 0xff) {
  case 3:
  case 4:
    cVar1 = this->includeComments;
    break;
  case 5:
    cVar1 = this->includeSkipped;
    break;
  case 6:
    if (this->includeSkipped != true) {
      return this;
    }
    sVar6 = parsing::Trivia::getSkippedTokens((Trivia *)&local_38);
    pTVar2 = sVar6._M_ptr;
    for (lVar5 = sVar6._M_extent._M_extent_value._M_extent_value << 4; lVar5 != 0;
        lVar5 = lVar5 + -0x10) {
      print(this,*pTVar2);
      pTVar2 = pTVar2 + 1;
    }
    return this;
  case 7:
    if (this->includeSkipped != true) {
      return this;
    }
    goto LAB_001eff99;
  case 8:
    if (this->includeDirectives != true) {
      if (this->includePreprocessed != true) {
        return this;
      }
      pSVar3 = parsing::Trivia::syntax((Trivia *)&local_38);
      local_28 = SyntaxNode::getFirstToken(pSVar3);
      sVar7 = parsing::Token::trivia(&local_28);
      pTVar4 = sVar7._M_ptr;
      for (lVar5 = sVar7._M_extent._M_extent_value._M_extent_value << 4; lVar5 != 0;
          lVar5 = lVar5 + -0x10) {
        print(this,*pTVar4);
        pTVar4 = pTVar4 + 1;
      }
      return this;
    }
LAB_001eff99:
    pSVar3 = parsing::Trivia::syntax((Trivia *)&local_38);
    print(this,pSVar3);
    return this;
  default:
    goto switchD_001efed4_default;
  }
  if (cVar1 == '\x01') {
switchD_001efed4_default:
    text = parsing::Trivia::getRawText((Trivia *)&local_38);
    append(this,text);
  }
  return this;
}

Assistant:

SyntaxPrinter& SyntaxPrinter::print(Trivia trivia) {
    switch (trivia.kind) {
        case TriviaKind::Directive:
            if (includeDirectives)
                print(*trivia.syntax());
            else if (includePreprocessed) {
                auto nestedTrivia = trivia.syntax()->getFirstToken().trivia();
                for (const auto& t : nestedTrivia)
                    print(t);
            }
            break;
        case TriviaKind::SkippedSyntax:
            if (includeSkipped)
                print(*trivia.syntax());
            break;
        case TriviaKind::SkippedTokens:
            if (includeSkipped) {
                for (Token t : trivia.getSkippedTokens())
                    print(t);
            }
            break;
        case TriviaKind::DisabledText:
            if (includeSkipped)
                append(trivia.getRawText());
            break;
        case TriviaKind::LineComment:
        case TriviaKind::BlockComment:
            if (!includeComments)
                break;
            [[fallthrough]];
        default:
            append(trivia.getRawText());
            break;
    }
    return *this;
}